

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O3

bool Jupiter_isBase64_s(char *in,size_t inLen)

{
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  
  if ((inLen & 3) != 0) {
    return false;
  }
  sVar2 = 0;
  do {
    bVar3 = inLen == sVar2;
    if (bVar3) {
      return bVar3;
    }
    pcVar1 = in + sVar2;
    sVar2 = sVar2 + 1;
  } while ("BBBBBBBBB@BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB>BBB?456789:;<=BBBABBB"[*pcVar1] != 'B');
  return bVar3;
}

Assistant:

bool Jupiter_isBase64_s(const char *in, size_t inLen)
{
	if (inLen % 4 != 0)
	{
		return false;
	}
	const char *end = in + inLen;
	while (in != end)
	{
		switch (Jupiter_base64DecodeTable[*in++])
		{
		case 66:
			return false;
		default:
			break;
		}
	}
	return true;
}